

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall imrt::EvaluationFunction::~EvaluationFunction(EvaluationFunction *this)

{
  _List_node_base *p_Var1;
  pointer piVar2;
  _List_node_base *p_Var3;
  
  this->_vptr_EvaluationFunction = (_func_int **)&PTR__EvaluationFunction_00133d08;
  p_Var3 = (this->Z_diff).
           super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->Z_diff) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->D);
  std::
  _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->beamlet2voxel_list)._M_h);
  std::
  _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->voxel2beamlet_list)._M_h);
  std::
  _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->beamlet_impact)._M_h);
  std::
  _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&(this->voxels)._M_t);
  piVar2 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->voxel_dose);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->Z);
  return;
}

Assistant:

EvaluationFunction::~EvaluationFunction() { }